

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void SubtractionHelper<unsigned_char,_long_long,_6>::
     SubtractThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (uchar *lhs,longlong *rhs,uchar *result)

{
  byte bVar1;
  ulong uVar2;
  char *in_RDX;
  ulong *in_RSI;
  byte *in_RDI;
  uint64_t tmp;
  
  if ((long)*in_RSI < 0) {
    uVar2 = (ulong)*in_RDI + (*in_RSI ^ 0xffffffffffffffff) + 1;
    bVar1 = std::numeric_limits<unsigned_char>::max();
    if (bVar1 < uVar2) goto LAB_0013ab63;
    *in_RDX = (char)uVar2;
  }
  else {
    if ((ulong)*in_RDI < *in_RSI) {
LAB_0013ab63:
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
    }
    *in_RDX = *in_RDI - (char)*in_RSI;
  }
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void SubtractThrow( const T& lhs, const U& rhs, T& result ) SAFEINT_CPP_THROW
    {
        // lhs is an unsigned int32 or smaller, rhs std::int64_t
        // must first see if rhs is positive or negative
        if( rhs >= 0 )
        {
            if( (std::uint64_t)rhs <= lhs )
            {
                result = (T)( lhs - (T)rhs );
                return;
            }
        }
        else
        {
            // we're now effectively adding
            // since lhs is 32-bit, and rhs cannot exceed 2^63
            // this addition cannot overflow
            std::uint64_t tmp = lhs + ~(std::uint64_t)( rhs ) + 1; // negation safe

            // but we could exceed MaxInt
            if(tmp <= std::numeric_limits<T>::max())
            {
                result = (T)tmp;
                return;
            }
        }

        E::SafeIntOnOverflow();
    }